

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodesel.cc
# Opt level: O2

RC __thiscall QL_NodeSel::DeleteNodes(QL_NodeSel *this)

{
  QL_Node *this_00;
  
  (*this->prevNode->_vptr_QL_Node[4])();
  this_00 = this->prevNode;
  if (this_00 != (QL_Node *)0x0) {
    QL_Node::~QL_Node(this_00);
  }
  operator_delete(this_00);
  if ((this->super_QL_Node).listsInitialized == true) {
    free((this->super_QL_Node).condList);
    free((this->super_QL_Node).attrsInRec);
    free(this->buffer);
    free((this->super_QL_Node).condsInNode);
  }
  (this->super_QL_Node).listsInitialized = false;
  return 0;
}

Assistant:

RC QL_NodeSel::DeleteNodes(){
  prevNode.DeleteNodes();
  delete &prevNode;
  if(listsInitialized == true){
    free(condList);
    free(attrsInRec);
    free(buffer);
    free(condsInNode);
  }
  listsInitialized = false;
  return (0);
}